

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.cpp
# Opt level: O2

void __thiscall btBoxShape::btBoxShape(btBoxShape *this,btVector3 *boxHalfExtents)

{
  undefined1 auVar1 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  btVector3 bVar2;
  
  btPolyhedralConvexShape::btPolyhedralConvexShape(&this->super_btPolyhedralConvexShape);
  (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
  super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btPolyhedralConvexShape_001edc40;
  (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
  super_btCollisionShape.m_shapeType = 0;
  btConvexInternalShape::setSafeMargin((btConvexInternalShape *)this,boxHalfExtents,0.1);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  bVar2 = operator*(boxHalfExtents,
                    (btVector3 *)
                    &(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                     super_btConvexShape.super_btCollisionShape.field_0x1c);
  auVar1._4_4_ = bVar2.m_floats[1] - extraout_XMM0_Da_00;
  auVar1._0_4_ = bVar2.m_floats[0] - extraout_XMM0_Da;
  auVar1._8_4_ = bVar2.m_floats[2] - extraout_XMM0_Da_01;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])
   (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.m_implicitShapeDimensions.
   m_floats = auVar1;
  return;
}

Assistant:

btBoxShape::btBoxShape( const btVector3& boxHalfExtents) 
: btPolyhedralConvexShape()
{
	m_shapeType = BOX_SHAPE_PROXYTYPE;

	setSafeMargin(boxHalfExtents);

	btVector3 margin(getMargin(),getMargin(),getMargin());
	m_implicitShapeDimensions = (boxHalfExtents * m_localScaling) - margin;
}